

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

BoundSheet *
Excel::Parser::parseBoundSheet(BoundSheet *__return_storage_ptr__,Record *record,BiffVersion ver)

{
  RecordSubstream *this;
  BiffVersion in_R9D;
  int16_t sheetType;
  int32_t pos;
  wstring sheetName;
  undefined2 local_6e;
  int local_6c;
  undefined4 *local_68;
  long local_60;
  undefined4 local_58;
  undefined4 uStack_54;
  wstring local_48;
  
  local_6c = 0;
  local_6e = 0;
  local_60 = 0;
  local_58 = 0;
  this = &record->m_stream;
  local_68 = &local_58;
  Stream::read<int>(&this->super_Stream,&local_6c,4);
  Stream::read<short>(&this->super_Stream,&local_6e,2);
  loadString_abi_cxx11_
            (&local_48,(Excel *)this,(Stream *)&record->m_borders,
             (vector<int,_std::allocator<int>_> *)0x1,ver,in_R9D);
  std::__cxx11::wstring::operator=((wstring *)&local_68,(wstring *)&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity * 4 + 4);
  }
  __return_storage_ptr__->m_BOFPosition = local_6c;
  __return_storage_ptr__->m_sheetType = (uint)local_6e._1_1_ << 8;
  (__return_storage_ptr__->m_sheetName)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_sheetName).field_2;
  std::__cxx11::wstring::_M_construct<wchar_t*>
            ((wstring *)&__return_storage_ptr__->m_sheetName,local_68,local_68 + local_60);
  if (local_68 != &local_58) {
    operator_delete(local_68,CONCAT44(uStack_54,local_58) * 4 + 4);
  }
  return __return_storage_ptr__;
}

Assistant:

inline BoundSheet
Parser::parseBoundSheet( Record & record, BOF::BiffVersion ver )
{
	int32_t pos = 0;
	int16_t sheetType = 0;
	std::wstring sheetName;

	record.dataStream().read( pos, 4 );

	record.dataStream().read( sheetType, 2 );

	sheetName = loadString( record.dataStream(), record.borders(), 1, ver );

	return BoundSheet( pos,
		BoundSheet::convertSheetType( sheetType ),
		sheetName );
}